

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O2

void __thiscall adios2::ADIOS::EnterComputationBlock(ADIOS *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,"in call to ADIOS::EnterComputationBlock()",&local_29);
  CheckPointer(this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  adios2::core::ADIOS::EnterComputationBlock();
  return;
}

Assistant:

void ADIOS::EnterComputationBlock() noexcept
{
    CheckPointer("in call to ADIOS::EnterComputationBlock()");
    m_ADIOS->EnterComputationBlock();
}